

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epc18_1.hpp
# Opt level: O3

void ExchCXX::kernel_traits<ExchCXX::BuiltinEPC18_1>::eval_exc_vxc_polar_impl
               (double rho_a,double rho_b,double *eps,double *vrho_a,double *vrho_b)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  
  dVar17 = rho_a - rho_b;
  dVar6 = rho_a + rho_b;
  dVar14 = 1.0 / dVar6;
  dVar19 = (rho_b + rho_b) * dVar14;
  dVar20 = 0.999999999999999;
  dVar10 = 0.999999999999999;
  if (1e-15 < dVar19) {
    dVar10 = dVar17 * dVar14;
  }
  bVar1 = 1e-15 < (rho_a + rho_a) * dVar14;
  dVar8 = -0.999999999999999;
  if (bVar1) {
    dVar8 = dVar10;
  }
  if (bVar1) {
    dVar20 = dVar14 * -dVar17;
  }
  bVar2 = 1e-15 < dVar19;
  dVar19 = dVar6 * (dVar8 + 1.0);
  dVar10 = -0.999999999999999;
  if (bVar2) {
    dVar10 = dVar20;
  }
  bVar3 = 1e-24 < rho_b;
  bVar4 = 1e-24 < rho_a;
  dVar12 = dVar10 + 1.0;
  dVar20 = cbrt(dVar19);
  dVar16 = cbrt(dVar6 * dVar12);
  dVar9 = dVar16 * 1.5874010519681996 * 0.5 + dVar20 * 1.5874010519681996 * 0.5;
  dVar7 = dVar9 * dVar9;
  dVar18 = dVar7 * dVar7 * 0.03;
  dVar24 = dVar18 * dVar7 + dVar9 * dVar7 * -0.1 + 1.8;
  dVar5 = 1.0 / dVar24;
  dVar25 = 1.0 / (dVar6 * dVar6);
  dVar15 = dVar17 * dVar25;
  dVar21 = 0.0;
  if (bVar1 && bVar2) {
    dVar21 = dVar14 - dVar15;
  }
  dVar11 = dVar12 * dVar5;
  dVar25 = dVar25 * -dVar17;
  dVar17 = 0.0;
  if (bVar1 && bVar2) {
    dVar17 = -dVar14 - dVar25;
  }
  dVar13 = 0.0;
  if (bVar1 && bVar2) {
    dVar13 = -dVar14 - dVar15;
  }
  dVar23 = dVar5 * dVar12 * (dVar8 + 1.0) * 0.25;
  dVar15 = 0.0;
  if (bVar1 && bVar2) {
    dVar15 = dVar14 - dVar25;
  }
  dVar25 = 1.5874010519681996 / (dVar20 * dVar20);
  dVar16 = 1.5874010519681996 / (dVar16 * dVar16);
  dVar14 = dVar7 * 0.1 * -3.0;
  dVar20 = dVar9 * dVar18 * 6.0;
  dVar12 = dVar12 * (1.0 / (dVar24 * dVar24));
  dVar7 = 0.0;
  if (bVar4 || bVar3) {
    auVar22._0_8_ = (dVar21 * dVar6 + 1.0 + dVar8) * dVar25;
    auVar22._8_8_ = dVar16 * (dVar17 * dVar6 + dVar10 + 1.0);
    auVar22 = divpd(auVar22,_DAT_01025800);
    dVar7 = auVar22._8_8_ + auVar22._0_8_;
    dVar7 = ((dVar19 * dVar12 * (dVar7 * dVar20 + dVar14 * dVar7) * 0.25 +
             -dVar19 * dVar5 * dVar17 * 0.25) - dVar11 * dVar21 * dVar6 * 0.25) - dVar23;
  }
  dVar17 = 0.0;
  if (bVar4 || bVar3) {
    auVar26._0_8_ = (dVar8 + dVar13 * dVar6 + 1.0) * dVar25;
    auVar26._8_8_ = dVar16 * (dVar15 * dVar6 + dVar10 + 1.0);
    auVar22 = divpd(auVar26,_DAT_01025800);
    dVar10 = auVar22._8_8_ + auVar22._0_8_;
    dVar17 = ((dVar19 * dVar12 * (dVar14 * dVar10 + dVar20 * dVar10) * 0.25 -
              dVar19 * dVar5 * dVar15 * 0.25) - dVar13 * dVar6 * dVar11 * 0.25) - dVar23;
  }
  dVar10 = 0.0;
  if (bVar4 || bVar3) {
    dVar10 = dVar11 * -dVar19 * 0.25;
  }
  *eps = dVar10;
  *vrho_a = dVar7 * dVar6 + dVar10;
  *vrho_b = dVar17 * dVar6 + *eps;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar_impl( double rho_a, double rho_b, double& eps, double& vrho_a, double& vrho_b ) {

    constexpr double t23 = constants::m_cbrt_2;
    constexpr double t24 = t23 * t23;


    const double t3 = rho_a <= dens_tol && rho_b <= dens_tol;
    const double t4 = rho_a + rho_b;
    const double t5 = 0.1e1 / t4;
    const double t8 = 0.2e1 * rho_a * t5 <= zeta_tol;
    const double t9 = zeta_tol - 0.1e1;
    const double t12 = 0.2e1 * rho_b * t5 <= zeta_tol;
    const double t13 = -t9;
    const double t14 = rho_a - rho_b;
    const double t16 = piecewise_functor_5( t8, t9, t12, t13, t14 * t5 );
    const double t17 = 0.1e1 + t16;
    const double t18 = t17 * t4;
    const double t19 = -t14;
    const double t21 = piecewise_functor_5( t12, t9, t8, t13, t19 * t5 );
    const double t22 = 0.1e1 + t21;
    const double t25 = safe_math::cbrt( t18 );
    const double t27 = t22 * t4;
    const double t28 = safe_math::cbrt( t27 );
    const double t31 = t24 * t25 / 0.2e1 + t24 * t28 / 0.2e1;
    const double t32 = t31 * t31;
    const double t33 = t32 * t31;
    const double t35 = t32 * t32;
    const double t38 = c * t35 * t32 - b * t33 + a;
    const double t39 = 0.1e1 / t38;
    const double t40 = t22 * t39;
    const double t43 = t4 * t4;
    const double t44 = 0.1e1 / t43;
    const double t45 = t14 * t44;
    const double t47 = piecewise_functor_5( t8, 0.0, t12, 0.0, t5 - t45 );
    const double t48 = t47 * t4;
    const double t50 = t17 * t22;
    const double t51 = t50 * t39;
    const double t52 = t19 * t44;
    const double t54 = piecewise_functor_5( t12, 0.0, t8, 0.0, -t5 - t52 );
    const double t55 = t54 * t39;
    const double t57 = t38 * t38;
    const double t58 = 0.1e1 / t57;
    const double t59 = t22 * t58;
    const double t60 = b * t32;
    const double t61 = t25 * t25;
    const double t63 = t24 / t61;
    const double t64 = t48 + 0.1e1 + t16;
    const double t66 = t28 * t28;
    const double t68 = t24 / t66;
    const double t70 = t54 * t4 + t21 + 0.1e1;
    const double t73 = t63 * t64 / 0.6e1 + t68 * t70 / 0.6e1;
    const double t77 = c * t35 * t31;
    const double t80 = -0.3e1 * t60 * t73 + 0.6e1 * t77 * t73;
    const double t81 = t59 * t80;
    const double t85 = piecewise_functor_3( t3, 0.0, -t18 * t55 / 0.4e1 + t18 * t81 / 0.4e1 - t48 * t40 / 0.4e1 - t51 / 0.4e1 );
    const double t88 = piecewise_functor_5( t8, 0.0, t12, 0.0, -t5 - t45 );
    const double t89 = t88 * t4;
    const double t92 = piecewise_functor_5( t12, 0.0, t8, 0.0, t5 - t52 );
    const double t93 = t92 * t39;
    const double t95 = t89 + 0.1e1 + t16;
    const double t98 = t92 * t4 + t21 + 0.1e1;
    const double t101 = t63 * t95 / 0.6e1 + t68 * t98 / 0.6e1;
    const double t106 = -0.3e1 * t60 * t101 + 0.6e1 * t77 * t101;
    const double t107 = t59 * t106;
    const double t111 = piecewise_functor_3( t3, 0.0, t18 * t107 / 0.4e1 - t18 * t93 / 0.4e1 - t89 * t40 / 0.4e1 - t51 / 0.4e1 );


    eps = piecewise_functor_3( t3, 0.0, -t18 * t40 / 0.4e1 );
    vrho_a = t4 * t85 + eps;
    vrho_b = t4 * t111 + eps;

  }